

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML256TableTranscoder.cpp
# Opt level: O0

XMLByte __thiscall
xercesc_4_0::XML256TableTranscoder::xlatOneTo(XML256TableTranscoder *this,XMLCh toXlat)

{
  XMLSize_t XVar1;
  XMLSize_t XVar2;
  XMLSize_t midOfs;
  XMLSize_t hiOfs;
  XMLSize_t lowOfs;
  XMLCh toXlat_local;
  XML256TableTranscoder *this_local;
  
  hiOfs = 0;
  midOfs = this->fToSize - 1;
  while ((XVar2 = (midOfs - hiOfs >> 1) + hiOfs, XVar1 = XVar2,
         (ushort)this->fToTable[XVar2].intCh < (ushort)toXlat ||
         (midOfs = XVar2, XVar1 = hiOfs, (ushort)toXlat < (ushort)this->fToTable[XVar2].intCh))) {
    hiOfs = XVar1;
    if (midOfs <= hiOfs + 1) {
      if (toXlat == this->fToTable[midOfs].intCh) {
        this_local._7_1_ = this->fToTable[midOfs].extCh;
      }
      else {
        this_local._7_1_ = '\0';
      }
      return this_local._7_1_;
    }
  }
  return this->fToTable[XVar2].extCh;
}

Assistant:

XMLByte XML256TableTranscoder::xlatOneTo(const XMLCh toXlat) const
{
    XMLSize_t lowOfs = 0;
    XMLSize_t hiOfs = fToSize - 1;
    do
    {
        // Calc the mid point of the low and high offset.
        const XMLSize_t midOfs = ((hiOfs - lowOfs) / 2) + lowOfs;

        //
        //  If our test char is greater than the mid point char, then
        //  we move up to the upper half. Else we move to the lower
        //  half. If its equal, then its our guy.
        //
        if (toXlat > fToTable[midOfs].intCh)
        {
            lowOfs = midOfs;
        }
         else if (toXlat < fToTable[midOfs].intCh)
        {
            hiOfs = midOfs;
        }
         else
        {
            return fToTable[midOfs].extCh;
        }
    }   while (lowOfs + 1 < hiOfs);

    // Check the high end of the range otherwise the
    // last item in the table may never be found.
        if (toXlat == fToTable[hiOfs].intCh)
        {
            return fToTable[hiOfs].extCh;
        }

    return 0;
}